

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_descriptor.cpp
# Opt level: O0

void __thiscall
Descriptor_Parse_Privkey_Mainnet_Uncompress_Test::TestBody
          (Descriptor_Parse_Privkey_Mainnet_Uncompress_Test *this)

{
  bool bVar1;
  reference this_00;
  char *pcVar2;
  char *pcVar3;
  char *in_R9;
  AssertionResult gtest_ar_4;
  CfdException *except_1;
  AssertHelper local_df0;
  Message local_de8;
  bool local_dd9;
  undefined1 local_dd8 [8];
  AssertionResult gtest_ar__1;
  string local_c60;
  AssertHelper local_c40;
  Message local_c38;
  bool local_c29;
  undefined1 local_c28 [8];
  AssertionResult gtest_ar_;
  Message local_c10;
  string local_c08;
  undefined1 local_be8 [8];
  AssertionResult gtest_ar_3;
  Message local_bd0;
  string local_bc8;
  undefined1 local_ba8 [8];
  AssertionResult gtest_ar_2;
  Message local_b90;
  undefined1 local_b88 [8];
  AssertionResult gtest_ar_1;
  Message local_b70;
  vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  local_b68;
  Pubkey local_b50;
  AssertHelper local_b38;
  Message local_b30;
  string local_b28;
  AssertHelper local_b08;
  Message local_b00;
  DescriptorScriptReference local_af8;
  AssertHelper local_7a8;
  Message local_7a0 [2];
  Script local_790;
  AssertionResult gtest_ar;
  CfdException *except;
  undefined1 local_5c8 [8];
  Pubkey pubkey;
  DescriptorScriptReference script_ref;
  string local_258 [8];
  string desc_str;
  Script locking_script;
  Descriptor desc;
  undefined1 local_90 [8];
  string descriptor2;
  undefined1 local_68 [8];
  string descriptor1;
  allocator local_31;
  string local_30 [8];
  string pubkey_hex;
  Descriptor_Parse_Privkey_Mainnet_Uncompress_Test *this_local;
  
  pubkey_hex.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_30,
             "04ef514f1aeb14baa6cc57ab3268fb329ca540c48454f7f46771ed731e34ba521a116bc35b3f8d748aea5dfad083a73961908797c97fc0ca4f8d874aba9778fc77"
             ,&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_68,"pkh(5JB4Tt43VA4qbBVRtf88CVKTkJ82pC6mhm9aHywDG27htnFHgqC)",
             (allocator *)(descriptor2.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(descriptor2.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_90,"wpkh(5JB4Tt43VA4qbBVRtf88CVKTkJ82pC6mhm9aHywDG27htnFHgqC)",
             (allocator *)(desc.root_node_.parent_kind_.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator
            ((allocator<char> *)(desc.root_node_.parent_kind_.field_2._M_local_buf + 0xf));
  cfd::core::Descriptor::Descriptor
            ((Descriptor *)
             &locking_script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::Script::Script((Script *)((long)&desc_str.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_258,"",
             (allocator *)
             ((long)&script_ref.addr_prefixes_.
                     super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&script_ref.addr_prefixes_.
                     super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::DescriptorScriptReference::DescriptorScriptReference
            ((DescriptorScriptReference *)
             &pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::Pubkey::Pubkey((Pubkey *)local_5c8);
  cfd::core::Descriptor::Parse
            ((Descriptor *)&except,(string *)local_68,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             0x0);
  cfd::core::Descriptor::operator=
            ((Descriptor *)
             &locking_script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(Descriptor *)&except);
  cfd::core::Descriptor::~Descriptor((Descriptor *)&except);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::GetLockingScript
                (&local_790,
                 (Descriptor *)
                 &locking_script.script_stack_.
                  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      cfd::core::Script::operator=((Script *)((long)&desc_str.field_2 + 8),&local_790);
      cfd::core::Script::~Script(&local_790);
    }
  }
  else {
    testing::Message::Message(local_7a0);
    testing::internal::AssertHelper::AssertHelper
              (&local_7a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x28c,
               "Expected: locking_script = desc.GetLockingScript() doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_7a8,local_7a0);
    testing::internal::AssertHelper::~AssertHelper(&local_7a8);
    testing::Message::~Message(local_7a0);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::GetReference
                (&local_af8,
                 (Descriptor *)
                 &locking_script.script_stack_.
                  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x0);
      cfd::core::DescriptorScriptReference::operator=
                ((DescriptorScriptReference *)
                 &pubkey.data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&local_af8);
      cfd::core::DescriptorScriptReference::~DescriptorScriptReference(&local_af8);
    }
  }
  else {
    testing::Message::Message(&local_b00);
    testing::internal::AssertHelper::AssertHelper
              (&local_b08,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x28d,
               "Expected: script_ref = desc.GetReference() doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_b08,&local_b00);
    testing::internal::AssertHelper::~AssertHelper(&local_b08);
    testing::Message::~Message(&local_b00);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::ToString_abi_cxx11_
                (&local_b28,
                 (Descriptor *)
                 &locking_script.script_stack_.
                  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,false);
      std::__cxx11::string::operator=(local_258,(string *)&local_b28);
      std::__cxx11::string::~string((string *)&local_b28);
    }
  }
  else {
    testing::Message::Message(&local_b30);
    testing::internal::AssertHelper::AssertHelper
              (&local_b38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x28e,
               "Expected: desc_str = desc.ToString(false) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_b38,&local_b30);
    testing::internal::AssertHelper::~AssertHelper(&local_b38);
    testing::Message::~Message(&local_b30);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::DescriptorScriptReference::GetKeyList
                (&local_b68,
                 (DescriptorScriptReference *)
                 &pubkey.data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      this_00 = std::
                vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                ::operator[](&local_b68,0);
      cfd::core::DescriptorKeyReference::GetPubkey(&local_b50,this_00);
      cfd::core::Pubkey::operator=((Pubkey *)local_5c8,&local_b50);
      cfd::core::Pubkey::~Pubkey(&local_b50);
      std::
      vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
      ::~vector(&local_b68);
    }
  }
  else {
    testing::Message::Message(&local_b70);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x28f,
               "Expected: pubkey = script_ref.GetKeyList()[0].GetPubkey() doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_b70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_b70);
  }
  pcVar2 = (char *)std::__cxx11::string::c_str();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_b88,"desc_str.c_str()","descriptor1.c_str()",pcVar2,pcVar3);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b88);
  if (!bVar1) {
    testing::Message::Message(&local_b90);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b88);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x290,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_b90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_b90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b88);
  cfd::core::Script::ToString_abi_cxx11_(&local_bc8,(Script *)((long)&desc_str.field_2 + 8));
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_ba8,"locking_script.ToString().c_str()",
             "\"OP_DUP OP_HASH160 06399b0a8229214e0614afa119531b46e1d1f29b OP_EQUALVERIFY OP_CHECKSIG\""
             ,pcVar2,
             "OP_DUP OP_HASH160 06399b0a8229214e0614afa119531b46e1d1f29b OP_EQUALVERIFY OP_CHECKSIG"
            );
  std::__cxx11::string::~string((string *)&local_bc8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ba8);
  if (!bVar1) {
    testing::Message::Message(&local_bd0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_ba8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x292,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_bd0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_bd0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ba8);
  cfd::core::Pubkey::GetHex_abi_cxx11_(&local_c08,(Pubkey *)local_5c8);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_be8,"pubkey.GetHex().c_str()","pubkey_hex.c_str()",pcVar2,pcVar3);
  std::__cxx11::string::~string((string *)&local_c08);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_be8);
  if (!bVar1) {
    testing::Message::Message(&local_c10);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_be8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x294,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_c10);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_c10);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_be8);
  bVar1 = cfd::core::Pubkey::IsCompress((Pubkey *)local_5c8);
  local_c29 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_c28,&local_c29,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c28);
  if (!bVar1) {
    testing::Message::Message(&local_c38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_c60,(internal *)local_c28,(AssertionResult *)"pubkey.IsCompress()","true",
               "false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_c40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x295,pcVar2);
    testing::internal::AssertHelper::operator=(&local_c40,&local_c38);
    testing::internal::AssertHelper::~AssertHelper(&local_c40);
    std::__cxx11::string::~string((string *)&local_c60);
    testing::Message::~Message(&local_c38);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c28);
  cfd::core::Descriptor::Parse
            ((Descriptor *)&gtest_ar__1.message_,(string *)local_90,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             0x0);
  cfd::core::Descriptor::operator=
            ((Descriptor *)
             &locking_script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(Descriptor *)&gtest_ar__1.message_
            );
  cfd::core::Descriptor::~Descriptor((Descriptor *)&gtest_ar__1.message_);
  local_dd9 = false;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_dd8,&local_dd9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_dd8);
  if (!bVar1) {
    testing::Message::Message(&local_de8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&except_1,(internal *)local_dd8,(AssertionResult *)0x6a1824,"false","true",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_df0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x299,pcVar2);
    testing::internal::AssertHelper::operator=(&local_df0,&local_de8);
    testing::internal::AssertHelper::~AssertHelper(&local_df0);
    std::__cxx11::string::~string((string *)&except_1);
    testing::Message::~Message(&local_de8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_dd8);
  cfd::core::Pubkey::~Pubkey((Pubkey *)local_5c8);
  cfd::core::DescriptorScriptReference::~DescriptorScriptReference
            ((DescriptorScriptReference *)
             &pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string(local_258);
  cfd::core::Script::~Script((Script *)((long)&desc_str.field_2 + 8));
  cfd::core::Descriptor::~Descriptor
            ((Descriptor *)
             &locking_script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

TEST(Descriptor, Parse_Privkey_Mainnet_Uncompress) {
  //   pubkey: '04ef514f1aeb14baa6cc57ab3268fb329ca540c48454f7f46771ed731e34ba521a116bc35b3f8d748aea5dfad083a73961908797c97fc0ca4f8d874aba9778fc77',
  //   privkey: '5JB4Tt43VA4qbBVRtf88CVKTkJ82pC6mhm9aHywDG27htnFHgqC'
  std::string pubkey_hex = "04ef514f1aeb14baa6cc57ab3268fb329ca540c48454f7f46771ed731e34ba521a116bc35b3f8d748aea5dfad083a73961908797c97fc0ca4f8d874aba9778fc77";
  std::string descriptor1 = "pkh(5JB4Tt43VA4qbBVRtf88CVKTkJ82pC6mhm9aHywDG27htnFHgqC)";
  std::string descriptor2 = "wpkh(5JB4Tt43VA4qbBVRtf88CVKTkJ82pC6mhm9aHywDG27htnFHgqC)";
  Descriptor desc;
  Script locking_script;
  std::string desc_str = "";
  DescriptorScriptReference script_ref;
  Pubkey pubkey;

  try {
    desc = Descriptor::Parse(descriptor1);
  } catch (const CfdException& except) {
    EXPECT_STREQ(except.what(), "");
  }

  EXPECT_NO_THROW(locking_script = desc.GetLockingScript());
  EXPECT_NO_THROW(script_ref = desc.GetReference());
  EXPECT_NO_THROW(desc_str = desc.ToString(false));
  EXPECT_NO_THROW(pubkey = script_ref.GetKeyList()[0].GetPubkey());
  EXPECT_STREQ(desc_str.c_str(), descriptor1.c_str());
  EXPECT_STREQ(locking_script.ToString().c_str(),
      "OP_DUP OP_HASH160 06399b0a8229214e0614afa119531b46e1d1f29b OP_EQUALVERIFY OP_CHECKSIG");
  EXPECT_STREQ(pubkey.GetHex().c_str(),
      pubkey_hex.c_str());
  EXPECT_FALSE(pubkey.IsCompress());

  try {
    desc = Descriptor::Parse(descriptor2);
    EXPECT_TRUE(false);
  } catch (const CfdException& except) {
    EXPECT_STREQ("Failed to unsing uncompressed pubkey.", except.what());
  }
}